

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_crt_check_parent(mbedtls_x509_crt *child,mbedtls_x509_crt *parent,int top,int bottom)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  mbedtls_asn1_named_data *pmVar8;
  size_t sVar9;
  mbedtls_asn1_named_data *pmVar10;
  
  pmVar10 = &child->issuer;
  pmVar8 = &parent->subject;
  while( true ) {
    if (pmVar10 == (mbedtls_asn1_named_data *)0x0) {
      return -1;
    }
    if (pmVar8 == (mbedtls_x509_name *)0x0) {
      return -1;
    }
    if ((pmVar10->oid).tag != (pmVar8->oid).tag) {
      return -1;
    }
    sVar3 = (pmVar10->oid).len;
    if (sVar3 != (pmVar8->oid).len) break;
    iVar5 = bcmp((pmVar10->oid).p,(pmVar8->oid).p,sVar3);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = (pmVar10->val).tag;
    iVar7 = (pmVar8->val).tag;
    if (((iVar5 != iVar7) || (sVar3 = (pmVar10->val).len, sVar3 != (pmVar8->val).len)) ||
       (iVar6 = bcmp((pmVar10->val).p,(pmVar8->val).p,sVar3), iVar6 != 0)) {
      if ((iVar5 != 0x13) && (iVar5 != 0xc)) {
        return -1;
      }
      if ((iVar7 != 0x13) && (iVar7 != 0xc)) {
        return -1;
      }
      sVar4 = (pmVar10->val).len;
      if (sVar4 != (pmVar8->val).len) {
        return -1;
      }
      if (sVar4 != 0) {
        sVar9 = 0;
        do {
          bVar1 = (pmVar10->val).p[sVar9];
          bVar2 = (pmVar8->val).p[sVar9];
          if (bVar1 != bVar2) {
            if ((bVar2 ^ bVar1) != 0x20) {
              return -1;
            }
            if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
              return -1;
            }
          }
          sVar9 = sVar9 + 1;
        } while (sVar4 != sVar9);
      }
    }
    if (pmVar10->next_merged != pmVar8->next_merged) {
      return -1;
    }
    pmVar10 = pmVar10->next;
    pmVar8 = pmVar8->next;
    if (pmVar8 == (mbedtls_asn1_named_data *)0x0 && pmVar10 == (mbedtls_asn1_named_data *)0x0) {
      if (top != 0) {
        iVar5 = parent->version;
        if ((bottom == 0) || (sVar3 = (child->raw).len, sVar3 != (parent->raw).len)) {
          if (iVar5 < 3) {
            return 0;
          }
        }
        else {
          iVar7 = bcmp((child->raw).p,(parent->raw).p,sVar3);
          if (iVar7 == 0 || iVar5 < 3) {
            return 0;
          }
        }
      }
      if (parent->ca_istrue != 0) {
        if (((parent->ext_types & 4) != 0) && ((parent->key_usage & 0x8005) != 4)) {
          return -1;
        }
        return 0;
      }
      return -1;
    }
  }
  return -1;
}

Assistant:

static int x509_crt_check_parent( const mbedtls_x509_crt *child,
                                  const mbedtls_x509_crt *parent,
                                  int top, int bottom )
{
    int need_ca_bit;

    /* Parent must be the issuer */
    if( x509_name_cmp( &child->issuer, &parent->subject ) != 0 )
        return( -1 );

    /* Parent must have the basicConstraints CA bit set as a general rule */
    need_ca_bit = 1;

    /* Exception: v1/v2 certificates that are locally trusted. */
    if( top && parent->version < 3 )
        need_ca_bit = 0;

    /* Exception: self-signed end-entity certs that are locally trusted. */
    if( top && bottom &&
        child->raw.len == parent->raw.len &&
        memcmp( child->raw.p, parent->raw.p, child->raw.len ) == 0 )
    {
        need_ca_bit = 0;
    }

    if( need_ca_bit && ! parent->ca_istrue )
        return( -1 );

#if defined(MBEDTLS_X509_CHECK_KEY_USAGE)
    if( need_ca_bit &&
        mbedtls_x509_crt_check_key_usage( parent, MBEDTLS_X509_KU_KEY_CERT_SIGN ) != 0 )
    {
        return( -1 );
    }
#endif

    return( 0 );
}